

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool __thiscall
cmCMakePresetsGraphInternal::EqualsCondition::Evaluate
          (EqualsCondition *this,
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          *expanders,int version,optional<bool> *out)

{
  ExpandMacroResult EVar1;
  bool local_83;
  _Optional_payload_base<bool> local_82;
  undefined1 local_80 [8];
  string rhs;
  undefined1 local_50 [8];
  string lhs;
  optional<bool> *out_local;
  int version_local;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  *expanders_local;
  EqualsCondition *this_local;
  
  lhs.field_2._8_8_ = out;
  std::__cxx11::string::string((string *)local_50,(string *)&this->Lhs);
  EVar1 = anon_unknown.dwarf_13216b::ExpandMacros((string *)local_50,expanders,version);
  if (EVar1 != Ok) {
    if (EVar1 == Ignore) {
      std::optional<bool>::reset((optional<bool> *)lhs.field_2._8_8_);
      this_local._7_1_ = true;
      rhs.field_2._8_4_ = 1;
      goto LAB_001e7c54;
    }
    if (EVar1 == Error) {
      this_local._7_1_ = false;
      rhs.field_2._8_4_ = 1;
      goto LAB_001e7c54;
    }
  }
  std::__cxx11::string::string((string *)local_80,(string *)&this->Rhs);
  EVar1 = anon_unknown.dwarf_13216b::ExpandMacros((string *)local_80,expanders,version);
  if (EVar1 == Ok) {
LAB_001e7c16:
    local_83 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_80);
    std::optional<bool>::optional<bool,_true>((optional<bool> *)&local_82,&local_83);
    *(_Optional_payload_base<bool> *)lhs.field_2._8_8_ = local_82;
    this_local._7_1_ = true;
  }
  else if (EVar1 == Ignore) {
    std::optional<bool>::reset((optional<bool> *)lhs.field_2._8_8_);
    this_local._7_1_ = true;
  }
  else {
    if (EVar1 != Error) goto LAB_001e7c16;
    this_local._7_1_ = false;
  }
  rhs.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_80);
LAB_001e7c54:
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool cmCMakePresetsGraphInternal::EqualsCondition::Evaluate(
  const std::vector<MacroExpander>& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string lhs = this->Lhs;
  CHECK_EXPAND(out, lhs, expanders, version);

  std::string rhs = this->Rhs;
  CHECK_EXPAND(out, rhs, expanders, version);

  out = (lhs == rhs);
  return true;
}